

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blt.c
# Opt level: O2

LispPTR N_OP_blt(LispPTR destptr,LispPTR sourceptr,LispPTR wordcount)

{
  DLword *pDVar1;
  LispPTR LVar2;
  ulong uVar3;
  
  pDVar1 = Lisp_world;
  if ((wordcount & 0xfff0000) == 0xe0000) {
    for (uVar3 = (ulong)((wordcount & 0xffff) * 2); LVar2 = wordcount, (int)uVar3 != 0;
        uVar3 = uVar3 - 2) {
      *(undefined2 *)((long)pDVar1 + uVar3 + (ulong)destptr * 2 + -2 ^ 2) =
           *(undefined2 *)((long)pDVar1 + uVar3 + (ulong)sourceptr * 2 + -2 ^ 2);
    }
  }
  else {
    MachineState.errorexit = 1;
    LVar2 = 0xffffffff;
    MachineState.tosvalue = wordcount;
  }
  return LVar2;
}

Assistant:

LispPTR N_OP_blt(LispPTR destptr, LispPTR sourceptr, LispPTR wordcount) {
  DLword *source68k;
  DLword *dest68k;
  int nw;

  if ((wordcount & SEGMASK) != S_POSITIVE) ERROR_EXIT(wordcount);
  nw = wordcount & 0xffff;

  source68k = NativeAligned2FromLAddr(sourceptr) + nw;
  dest68k = NativeAligned2FromLAddr(destptr) + nw;

  while (nw) {
    (GETWORD(--dest68k)) = GETWORD(--source68k);
    nw--;
  }

  return (wordcount);
}